

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_hmac_setup_internal
          (psa_hmac_internal_data *hmac,uint8_t *key,size_t key_length,psa_algorithm_t hash_alg)

{
  uint uVar1;
  size_t sVar2;
  psa_status_t pVar3;
  ulong uVar4;
  size_t sVar5;
  size_t __n;
  ulong input_length;
  uint8_t ipad [128];
  size_t local_c0;
  byte local_b8 [136];
  
  uVar1 = hash_alg - 1;
  if (((byte)uVar1 < 0x12) && ((0x39f9fU >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar4 = *(ulong *)(&DAT_0013a4d0 + (ulong)(uVar1 & 0xff) * 8);
  }
  else {
    uVar4 = (ulong)((char)hash_alg == '\x13') << 6;
  }
  if (hash_alg + 0xfeffffff < 0xb) {
    input_length = *(ulong *)(&DAT_0013a560 + (ulong)(hash_alg + 0xfeffffff) * 8);
  }
  else {
    input_length = 0;
  }
  if (input_length < uVar4) {
    return -0x86;
  }
  local_c0 = key_length;
  if (input_length < key_length) {
    pVar3 = psa_hash_compute(hash_alg,key,key_length,local_b8,0x80,&local_c0);
    if (pVar3 != 0) goto LAB_001126a2;
  }
  else if (key_length != 0) {
    memcpy(local_b8,key,key_length);
  }
  sVar2 = local_c0;
  if (local_c0 != 0) {
    sVar5 = 0;
    do {
      local_b8[sVar5] = local_b8[sVar5] ^ 0x36;
      sVar5 = sVar5 + 1;
    } while (local_c0 != sVar5);
  }
  __n = input_length - local_c0;
  memset(local_b8 + local_c0,0x36,__n);
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      hmac->opad[sVar5] = local_b8[sVar5] ^ 0x6a;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  memset(hmac->opad + sVar2,0x5c,__n);
  pVar3 = psa_hash_setup(&hmac->hash_ctx,hash_alg);
  if (pVar3 == 0) {
    pVar3 = psa_hash_update(&hmac->hash_ctx,local_b8,input_length);
  }
LAB_001126a2:
  mbedtls_platform_zeroize(local_b8,0x80);
  return pVar3;
}

Assistant:

static psa_status_t psa_hmac_setup_internal( psa_hmac_internal_data *hmac,
                                             const uint8_t *key,
                                             size_t key_length,
                                             psa_algorithm_t hash_alg )
{
    uint8_t ipad[PSA_HMAC_MAX_HASH_BLOCK_SIZE];
    size_t i;
    size_t hash_size = PSA_HASH_SIZE( hash_alg );
    size_t block_size = psa_get_hash_block_size( hash_alg );
    psa_status_t status;

    /* Sanity checks on block_size, to guarantee that there won't be a buffer
     * overflow below. This should never trigger if the hash algorithm
     * is implemented correctly. */
    /* The size checks against the ipad and opad buffers cannot be written
     * `block_size > sizeof( ipad ) || block_size > sizeof( hmac->opad )`
     * because that triggers -Wlogical-op on GCC 7.3. */
    if( block_size > sizeof( ipad ) )
        return( PSA_ERROR_NOT_SUPPORTED );
    if( block_size > sizeof( hmac->opad ) )
        return( PSA_ERROR_NOT_SUPPORTED );
    if( block_size < hash_size )
        return( PSA_ERROR_NOT_SUPPORTED );

    if( key_length > block_size )
    {
        status = psa_hash_compute( hash_alg, key, key_length,
                                   ipad, sizeof( ipad ), &key_length );
        if( status != PSA_SUCCESS )
            goto cleanup;
    }
    /* A 0-length key is not commonly used in HMAC when used as a MAC,
     * but it is permitted. It is common when HMAC is used in HKDF, for
     * example. Don't call `memcpy` in the 0-length because `key` could be
     * an invalid pointer which would make the behavior undefined. */
    else if( key_length != 0 )
        memcpy( ipad, key, key_length );

    /* ipad contains the key followed by garbage. Xor and fill with 0x36
     * to create the ipad value. */
    for( i = 0; i < key_length; i++ )
        ipad[i] ^= 0x36;
    memset( ipad + key_length, 0x36, block_size - key_length );

    /* Copy the key material from ipad to opad, flipping the requisite bits,
     * and filling the rest of opad with the requisite constant. */
    for( i = 0; i < key_length; i++ )
        hmac->opad[i] = ipad[i] ^ 0x36 ^ 0x5C;
    memset( hmac->opad + key_length, 0x5C, block_size - key_length );

    status = psa_hash_setup( &hmac->hash_ctx, hash_alg );
    if( status != PSA_SUCCESS )
        goto cleanup;

    status = psa_hash_update( &hmac->hash_ctx, ipad, block_size );

cleanup:
    mbedtls_platform_zeroize( ipad, sizeof(ipad) );

    return( status );
}